

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O2

bool google::protobuf::compiler::annotation_test_util::AnnotationMatchesSubstring
               (string *file_content,Annotation *annotation,string *expected_text)

{
  bool bVar1;
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  annotations;
  _Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  local_38;
  Annotation *local_18;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = annotation;
  std::
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ::push_back((vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
               *)&local_38,&local_18);
  bVar1 = AtLeastOneAnnotationMatchesSubstring
                    (file_content,
                     (vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                      *)&local_38,expected_text,
                     (optional<google::protobuf::GeneratedCodeInfo_Annotation_Semantic>)0x0);
  std::
  _Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ::~_Vector_base(&local_38);
  return bVar1;
}

Assistant:

bool AnnotationMatchesSubstring(const std::string& file_content,
                                const GeneratedCodeInfo::Annotation* annotation,
                                const std::string& expected_text) {
  std::vector<const GeneratedCodeInfo::Annotation*> annotations;
  annotations.push_back(annotation);
  return AtLeastOneAnnotationMatchesSubstring(file_content, annotations,
                                              expected_text);
}